

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

void matd_ltriangle_solve(matd_t *L,double *b,double *x)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  uVar1 = L->ncols;
  lVar2 = (long)(int)uVar1;
  if (0 < lVar2) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      dVar7 = b[lVar4];
      lVar6 = 0;
      iVar5 = 0;
      if (lVar4 != 0) {
        do {
          dVar7 = dVar7 - (double)L[(ulong)(uint)((int)lVar3 + (int)lVar6) + 1] * x[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
        iVar5 = (int)lVar4;
      }
      x[lVar4] = dVar7 / (double)L[(ulong)(iVar5 * (uVar1 + 1)) + 1];
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + lVar2;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

void matd_ltriangle_solve(matd_t *L, const TYPE *b, TYPE *x)
{
    int n = L->ncols;

    for (int i = 0; i < n; i++) {
        double acc = b[i];

        for (int j = 0; j < i; j++) {
            acc -= MATD_EL(L, i, j)*x[j];
        }

        x[i] = acc / MATD_EL(L, i, i);
    }
}